

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

void __thiscall SQVM::CloseOuters(SQVM *this,SQObjectPtr *stackindex)

{
  SQOuter *pSVar1;
  bool bVar2;
  SQOuter *p;
  SQObjectPtr *stackindex_local;
  SQVM *this_local;
  
  while( true ) {
    pSVar1 = this->_openouters;
    bVar2 = false;
    if (pSVar1 != (SQOuter *)0x0) {
      bVar2 = stackindex <= pSVar1->_valptr;
    }
    if (!bVar2) break;
    ::SQObjectPtr::operator=(&pSVar1->_value,pSVar1->_valptr);
    pSVar1->_valptr = &pSVar1->_value;
    this->_openouters = pSVar1->_next;
    if ((pSVar1 != (SQOuter *)0x0) &&
       ((pSVar1->super_SQCollectable).super_SQRefCounted._uiRef =
             (pSVar1->super_SQCollectable).super_SQRefCounted._uiRef - 1,
       (pSVar1->super_SQCollectable).super_SQRefCounted._uiRef == 0)) {
      (*(pSVar1->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  return;
}

Assistant:

void SQVM::CloseOuters(SQObjectPtr *stackindex) {
  SQOuter *p;
  while ((p = _openouters) != NULL && p->_valptr >= stackindex) {
    p->_value = *(p->_valptr);
    p->_valptr = &p->_value;
    _openouters = p->_next;
    __ObjRelease(p);
  }
}